

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O3

void __thiscall tst_RootIndexProxyModel::removeRow(tst_RootIndexProxyModel *this)

{
  undefined8 uVar1;
  quintptr qVar2;
  QAbstractItemModel *pQVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QAbstractItemModel *obj;
  QAbstractItemModelTester *this_00;
  RootIndexProxyModel proxyModel;
  QSignalSpy proxyRowsAboutToBeRemovedSpy;
  QSignalSpy proxyRowsRemovedSpy;
  QSignalSpy sourceRowsRemovedSpy;
  QSignalSpy sourceRowsAboutToBeRemovedSpy;
  QArrayDataPointer<QVariant> local_2a8;
  QModelIndex local_288;
  QModelIndex local_268;
  QModelIndex local_248;
  QSignalSpy local_230;
  QSignalSpy local_1b0;
  QSignalSpy local_130;
  QSignalSpy local_b0;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  obj = createTreeModel(&this->super_QObject);
  RootIndexProxyModel::RootIndexProxyModel((RootIndexProxyModel *)&local_248,(QObject *)0x0);
  this_00 = (QAbstractItemModelTester *)operator_new(0x10);
  QAbstractItemModelTester::QAbstractItemModelTester
            (this_00,(QAbstractItemModel *)&local_248,QtTest,(QObject *)obj);
  *(undefined ***)this_00 = &PTR_metaObject_00124c88;
  RootIndexProxyModel::setSourceModel((QAbstractItemModel *)&local_248);
  local_1b0._0_8_ = (undefined **)0xffffffffffffffff;
  local_1b0._8_8_ = 0;
  local_1b0.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  (**(code **)(*(long *)obj + 0x60))(&local_230,obj,1,0);
  RootIndexProxyModel::setRootIndex(&local_248);
  QSignalSpy::QSignalSpy
            (&local_230,(QObject *)&local_248,"2rowsAboutToBeRemoved(QModelIndex, int, int)");
  cVar4 = QTest::qVerify(local_230.sig.d.size != 0,"proxyRowsAboutToBeRemovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0xff);
  if (cVar4 != '\0') {
    QSignalSpy::QSignalSpy(&local_1b0,(QObject *)&local_248,"2rowsRemoved(QModelIndex, int, int)");
    cVar4 = QTest::qVerify(local_1b0.sig.d.size != 0,"proxyRowsRemovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0x101);
    if (cVar4 != '\0') {
      QSignalSpy::QSignalSpy
                (&local_b0,(QObject *)obj,"2rowsAboutToBeRemoved(QModelIndex, int, int)");
      cVar4 = QTest::qVerify(local_b0.sig.d.size != 0,"sourceRowsAboutToBeRemovedSpy.isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0x103);
      if (cVar4 != '\0') {
        QSignalSpy::QSignalSpy(&local_130,(QObject *)obj,"2rowsRemoved(QModelIndex, int, int)");
        cVar4 = QTest::qVerify(local_130.sig.d.size != 0,"sourceRowsRemovedSpy.isValid()","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0x105);
        if (cVar4 != '\0') {
          local_2a8.d = (Data *)0xffffffffffffffff;
          local_2a8.ptr = (QVariant *)0x0;
          local_2a8.size = 0;
          (**(code **)(*(long *)obj + 0x60))(&local_288,obj,1,0);
          iVar6 = (**(code **)(*(long *)obj + 0x78))(obj,&local_288);
          local_288._0_8_ = (Data *)0xffffffffffffffff;
          local_288.i = 0;
          local_288.m = (QAbstractItemModel *)0x0;
          iVar7 = RootIndexProxyModel::rowCount(&local_248);
          cVar4 = QTest::qCompare(iVar6,iVar7,"oldRowCount","proxyModel.rowCount()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                  ,0x107);
          if (cVar4 != '\0') {
            local_288._0_8_ = (Data *)0xffffffffffffffff;
            local_288.i = 0;
            local_288.m = (QAbstractItemModel *)0x0;
            RootIndexProxyModel::removeRows((int)&local_248,1,(QModelIndex *)0x1);
            local_288._0_8_ = (Data *)0xffffffffffffffff;
            local_288.i = 0;
            local_288.m = (QAbstractItemModel *)0x0;
            iVar7 = RootIndexProxyModel::rowCount(&local_248);
            cVar4 = QTest::qCompare(iVar6 + -1,iVar7,"oldRowCount - 1","proxyModel.rowCount()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                    ,0x109);
            if (cVar4 != '\0') {
              local_2a8.d = (Data *)0xffffffffffffffff;
              local_2a8.ptr = (QVariant *)0x0;
              local_2a8.size = 0;
              (**(code **)(*(long *)obj + 0x60))(&local_288,obj,1,0);
              iVar7 = (**(code **)(*(long *)obj + 0x78))(obj,&local_288);
              cVar4 = QTest::qCompare(iVar6 + -1,iVar7,"oldRowCount - 1",
                                      "baseModel->rowCount(baseModel->index(1, 0))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                      ,0x10a);
              if (cVar4 != '\0') {
                cVar4 = QTest::qCompare(local_230.super_QList<QList<QVariant>_>.d.size,1,
                                        "proxyRowsAboutToBeRemovedSpy.count()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                        ,0x10b);
                if (cVar4 != '\0') {
                  QList<QList<QVariant>_>::takeFirst
                            ((value_type *)&local_2a8,
                             (QList<QList<QVariant>_> *)((long)&local_230 + 0x10));
                  QVariant::value<QModelIndex>(&local_288,local_2a8.ptr);
                  local_268._0_8_ = (Data *)0xffffffffffffffff;
                  local_268.i = 0;
                  local_268.m = (QAbstractItemModel *)0x0;
                  bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                    (&local_288,&local_268,"arguments.at(0).value<QModelIndex>()",
                                     "QModelIndex()",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0x10d);
                  if (bVar5) {
                    iVar6 = QVariant::value<int>(local_2a8.ptr + 1);
                    cVar4 = QTest::qCompare(iVar6,1,"arguments.at(1).value<int>()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                            ,0x10e);
                    if (cVar4 != '\0') {
                      iVar6 = QVariant::value<int>(local_2a8.ptr + 2);
                      cVar4 = QTest::qCompare(iVar6,1,"arguments.at(2).value<int>()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                              ,0x10f);
                      if (cVar4 != '\0') {
                        cVar4 = QTest::qCompare(local_1b0.super_QList<QList<QVariant>_>.d.size,1,
                                                "proxyRowsRemovedSpy.count()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                ,0x110);
                        if (cVar4 != '\0') {
                          QList<QList<QVariant>_>::takeFirst
                                    ((value_type *)&local_268,
                                     (QList<QList<QVariant>_> *)((long)&local_1b0 + 0x10));
                          pQVar3 = local_268.m;
                          qVar2 = local_268.i;
                          uVar1 = local_268._0_8_;
                          local_288.m = (QAbstractItemModel *)local_2a8.size;
                          local_288.i = (quintptr)local_2a8.ptr;
                          local_288._0_8_ = local_2a8.d;
                          local_268._0_8_ = (Data *)0x0;
                          local_268.i = 0;
                          local_268.m = (QAbstractItemModel *)0x0;
                          local_2a8.d = (Data *)uVar1;
                          local_2a8.ptr = (QVariant *)qVar2;
                          local_2a8.size = (qsizetype)pQVar3;
                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                    ((QArrayDataPointer<QVariant> *)&local_288);
                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                    ((QArrayDataPointer<QVariant> *)&local_268);
                          QVariant::value<QModelIndex>(&local_288,local_2a8.ptr);
                          local_268._0_8_ = (Data *)0xffffffffffffffff;
                          local_268.i = 0;
                          local_268.m = (QAbstractItemModel *)0x0;
                          bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                            (&local_288,&local_268,
                                             "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0x112);
                          if (bVar5) {
                            iVar6 = QVariant::value<int>(local_2a8.ptr + 1);
                            cVar4 = QTest::qCompare(iVar6,1,"arguments.at(1).value<int>()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x113);
                            if (cVar4 != '\0') {
                              iVar6 = QVariant::value<int>(local_2a8.ptr + 2);
                              cVar4 = QTest::qCompare(iVar6,1,"arguments.at(2).value<int>()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x114);
                              if (cVar4 != '\0') {
                                cVar4 = QTest::qCompare(local_b0.super_QList<QList<QVariant>_>.d.
                                                        size,1,
                                                  "sourceRowsAboutToBeRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x115);
                                if (cVar4 != '\0') {
                                  QList<QList<QVariant>_>::takeFirst
                                            ((value_type *)&local_268,
                                             (QList<QList<QVariant>_> *)((long)&local_b0 + 0x10));
                                  pQVar3 = local_268.m;
                                  qVar2 = local_268.i;
                                  uVar1 = local_268._0_8_;
                                  local_288.m = (QAbstractItemModel *)local_2a8.size;
                                  local_288.i = (quintptr)local_2a8.ptr;
                                  local_288._0_8_ = local_2a8.d;
                                  local_268._0_8_ = (Data *)0x0;
                                  local_268.i = 0;
                                  local_268.m = (QAbstractItemModel *)0x0;
                                  local_2a8.d = (Data *)uVar1;
                                  local_2a8.ptr = (QVariant *)qVar2;
                                  local_2a8.size = (qsizetype)pQVar3;
                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                            ((QArrayDataPointer<QVariant> *)&local_288);
                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                            ((QArrayDataPointer<QVariant> *)&local_268);
                                  QVariant::value<QModelIndex>(&local_288,local_2a8.ptr);
                                  local_30 = 0xffffffffffffffff;
                                  local_28 = 0;
                                  uStack_20 = 0;
                                  (**(code **)(*(long *)obj + 0x60))(&local_268,obj,1,0);
                                  bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                                    (&local_288,&local_268,
                                                     "arguments.at(0).value<QModelIndex>()",
                                                     "baseModel->index(1, 0)",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x117);
                                  if (bVar5) {
                                    iVar6 = QVariant::value<int>(local_2a8.ptr + 1);
                                    cVar4 = QTest::qCompare(iVar6,1,"arguments.at(1).value<int>()",
                                                            "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x118);
                                    if (cVar4 != '\0') {
                                      iVar6 = QVariant::value<int>(local_2a8.ptr + 2);
                                      cVar4 = QTest::qCompare(iVar6,1,"arguments.at(2).value<int>()"
                                                              ,"1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x119);
                                      if (cVar4 != '\0') {
                                        cVar4 = QTest::qCompare(local_130.
                                                                super_QList<QList<QVariant>_>.d.size
                                                                ,1,"sourceRowsRemovedSpy.count()",
                                                                "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11a);
                                        if (cVar4 != '\0') {
                                          QList<QList<QVariant>_>::takeFirst
                                                    ((value_type *)&local_268,
                                                     (QList<QList<QVariant>_> *)
                                                     ((long)&local_130 + 0x10));
                                          pQVar3 = local_268.m;
                                          qVar2 = local_268.i;
                                          uVar1 = local_268._0_8_;
                                          local_288.m = (QAbstractItemModel *)local_2a8.size;
                                          local_288.i = (quintptr)local_2a8.ptr;
                                          local_288._0_8_ = local_2a8.d;
                                          local_268._0_8_ = (Data *)0x0;
                                          local_268.i = 0;
                                          local_268.m = (QAbstractItemModel *)0x0;
                                          local_2a8.d = (Data *)uVar1;
                                          local_2a8.ptr = (QVariant *)qVar2;
                                          local_2a8.size = (qsizetype)pQVar3;
                                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                    ((QArrayDataPointer<QVariant> *)&local_288);
                                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                    ((QArrayDataPointer<QVariant> *)&local_268);
                                          QVariant::value<QModelIndex>(&local_288,local_2a8.ptr);
                                          local_30 = 0xffffffffffffffff;
                                          local_28 = 0;
                                          uStack_20 = 0;
                                          (**(code **)(*(long *)obj + 0x60))(&local_268,obj,1,0);
                                          bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                                                            (&local_288,&local_268,
                                                             "arguments.at(0).value<QModelIndex>()",
                                                             "baseModel->index(1, 0)",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11c);
                                          if (bVar5) {
                                            iVar6 = QVariant::value<int>(local_2a8.ptr + 1);
                                            cVar4 = QTest::qCompare(iVar6,1,
                                                  "arguments.at(1).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11d);
                                            if (cVar4 != '\0') {
                                              iVar6 = QVariant::value<int>(local_2a8.ptr + 2);
                                              cVar4 = QTest::qCompare(iVar6,1,
                                                  "arguments.at(2).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x11e);
                                              if (cVar4 != '\0') {
                                                QObject::deleteLater();
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_2a8);
                }
              }
            }
          }
        }
        local_130._0_8_ = &PTR_metaObject_00124ba0;
        QObject::~QObject((QObject *)((long)&local_130 + 0x58));
        if (&(local_130.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_130.args.d.d)->super_QArrayData,4,8);
          }
        }
        if (&(local_130.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_130.sig.d.d)->super_QArrayData,1,8);
          }
        }
        QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
                  ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_130 + 0x10));
        QObject::~QObject(&local_130.super_QObject);
      }
      local_b0._0_8_ = &PTR_metaObject_00124ba0;
      QObject::~QObject((QObject *)((long)&local_b0 + 0x58));
      if (&(local_b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_b0.args.d.d)->super_QArrayData,4,8);
        }
      }
      if (&(local_b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_b0.sig.d.d)->super_QArrayData,1,8);
        }
      }
      QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
                ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_b0 + 0x10));
      QObject::~QObject(&local_b0.super_QObject);
    }
    local_1b0._0_8_ = &PTR_metaObject_00124ba0;
    QObject::~QObject((QObject *)((long)&local_1b0 + 0x58));
    if (&(local_1b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_1b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_1b0.args.d.d)->super_QArrayData,4,8);
      }
    }
    if (&(local_1b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_1b0.sig.d.d)->super_QArrayData,1,8);
      }
    }
    QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
              ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_1b0 + 0x10));
    QObject::~QObject(&local_1b0.super_QObject);
  }
  local_230._0_8_ = &PTR_metaObject_00124ba0;
  QObject::~QObject((QObject *)((long)&local_230 + 0x58));
  if (&(local_230.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_230.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_230.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_230.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_230 + 0x10));
  QObject::~QObject(&local_230.super_QObject);
  RootIndexProxyModel::~RootIndexProxyModel((RootIndexProxyModel *)&local_248);
  return;
}

Assistant:

void tst_RootIndexProxyModel::removeRow()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = createTreeModel(this);
    RootIndexProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setRootIndex(baseModel->index(1, 0));
    QSignalSpy proxyRowsAboutToBeRemovedSpy(&proxyModel, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxyRowsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxyRowsRemovedSpy(&proxyModel, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(proxyRowsRemovedSpy.isValid());
    QSignalSpy sourceRowsAboutToBeRemovedSpy(baseModel, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(sourceRowsAboutToBeRemovedSpy.isValid());
    QSignalSpy sourceRowsRemovedSpy(baseModel, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(sourceRowsRemovedSpy.isValid());
    int oldRowCount = baseModel->rowCount(baseModel->index(1, 0));
    QCOMPARE(oldRowCount, proxyModel.rowCount());
    proxyModel.removeRows(1, 1);
    QCOMPARE(oldRowCount - 1, proxyModel.rowCount());
    QCOMPARE(oldRowCount - 1, baseModel->rowCount(baseModel->index(1, 0)));
    QCOMPARE(proxyRowsAboutToBeRemovedSpy.count(), 1);
    QList<QVariant> arguments = proxyRowsAboutToBeRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(proxyRowsRemovedSpy.count(), 1);
    arguments = proxyRowsRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsAboutToBeRemovedSpy.count(), 1);
    arguments = sourceRowsAboutToBeRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceRowsRemovedSpy.count(), 1);
    arguments = sourceRowsRemovedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}